

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamEuler::EvaluateSectionForceTorque
          (ChElementBeamEuler *this,double eta,ChVector<double> *Fforce,ChVector<double> *Mtorque)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  element_type *peVar9;
  undefined1 auVar10 [16];
  ChElementBeamEuler *pCVar11;
  int iVar12;
  long lVar13;
  void *pvVar14;
  undefined8 *puVar15;
  Index col;
  double *pdVar16;
  ActualDstType actualDst;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double in_XMM0_Qb;
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ChVectorDynamic<> displ_ec;
  ChVectorDynamic<> displ;
  ChMatrix33<double> Rotsect0;
  ChMatrixNM<double,_6,_6> TcA;
  ChMatrixNM<double,_6,_6> Klaw_d;
  ChMatrixNM<double,_6,_6> TA;
  ChVectorN<double,_6> wrench;
  type tmp;
  ChMatrixNM<double,_6,_6> RotsectA;
  ChMatrixNM<double,_12,_12> Tc;
  ChMatrixNM<double,_6,_6> Klaw_r;
  ChMatrixNM<double,_6,_6> TsA;
  ChMatrixNM<double,_12,_12> Rotsect;
  ChMatrixNM<double,_12,_12> Ts;
  ChMatrixNM<double,_12,_12> T;
  undefined8 auStack_2036 [9];
  undefined8 auStack_1fe8 [8];
  undefined8 uStack_1fa4;
  undefined1 auStack_1f9a [8];
  undefined8 uStack_1f92;
  undefined1 *puStack_1f88;
  Matrix<double,__1,_1,_0,__1,_1> local_1f80;
  ChElementBeamEuler *local_1f68;
  undefined1 local_1f60 [232];
  double dStack_1e78;
  double dStack_1e70;
  double dStack_1e68;
  LhsNested pMStack_1e60;
  double dStack_1e58;
  double dStack_1e50;
  double dStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  LhsNested pMStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 local_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 uStack_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_1d40;
  Matrix<double,_12,_12,_1,_12,_12> *pMStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  ulong uStack_1d10;
  LhsNested pMStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  ulong auStack_1ce0 [2];
  LhsNested pMStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  ulong auStack_1cb0 [3];
  LhsNested pMStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  ulong auStack_1c80 [4];
  LhsNested local_1c60;
  undefined8 uStack_1c58;
  ulong auStack_1c50 [5];
  LhsNested pMStack_1c28;
  undefined1 local_1c20 [16];
  undefined1 local_1c10 [16];
  undefined1 local_1c00 [16];
  undefined1 local_1bf0 [16];
  undefined1 local_1be0 [16];
  undefined1 local_1bd0 [16];
  undefined1 local_1bc0 [16];
  undefined1 local_1bb0 [16];
  undefined1 local_1ba0 [16];
  undefined1 local_1b90 [16];
  undefined1 local_1b80 [16];
  undefined1 local_1b70 [16];
  undefined1 local_1b60 [16];
  undefined1 local_1b50 [16];
  undefined1 local_1b40 [16];
  undefined1 local_1b30 [16];
  undefined1 local_1b20 [16];
  undefined1 local_1b10 [16];
  undefined1 local_1af0 [48];
  Matrix<double,_12,_12,_1,_12,_12> local_1ac0;
  undefined1 local_1640 [328];
  double dStack_14f8;
  double local_14f0;
  double dStack_14e8;
  LhsNested local_14e0;
  double dStack_14d8;
  double local_14a0;
  double dStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  LhsNested pMStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  double local_1290;
  double dStack_1288;
  double local_1280;
  double dStack_1278;
  LhsNested local_1270;
  double dStack_1268;
  double local_1230;
  double dStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  LhsNested pMStack_11b8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined8 uStack_1088;
  assign_op<double,_double> *local_1080;
  double dStack_1078;
  double dStack_1070;
  double dStack_1068;
  double dStack_1060;
  double dStack_1058;
  RhsNested pMStack_1050;
  double dStack_1048;
  double local_1040;
  double dStack_1038;
  double dStack_1030;
  double dStack_1028;
  RhsNested pMStack_1020;
  double dStack_1018;
  double dStack_1010;
  double dStack_1008;
  double local_1000;
  double dStack_ff8;
  double dStack_ff0;
  double dStack_fe8;
  double dStack_fe0;
  double dStack_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double local_fc0;
  double local_fb8;
  double local_fb0;
  double local_fa8;
  double local_fa0;
  double dStack_f98;
  double dStack_f90;
  double dStack_f88;
  double dStack_f80;
  double dStack_f78;
  double dStack_f70;
  double dStack_f68;
  undefined1 local_f40 [72];
  double dStack_ef8;
  double dStack_ef0;
  double dStack_ee8;
  double dStack_ee0;
  double dStack_ed8;
  double dStack_ed0;
  LhsNested pMStack_ec8;
  undefined1 local_ec0 [16];
  double dStack_eb0;
  double dStack_ea8;
  double dStack_ea0;
  double dStack_e98;
  double dStack_e90;
  double dStack_e88;
  double local_e80;
  double dStack_e78;
  double local_e70;
  double dStack_e68;
  double local_e60;
  double dStack_e58;
  double dStack_e50;
  double dStack_e48;
  double dStack_e40;
  double dStack_e38;
  double dStack_e30;
  double dStack_e28;
  undefined8 auStack_e10 [2];
  Matrix<double,_12,_12,_1,_12,_12> local_e00;
  Matrix<double,_12,_12,_1,_12,_12> local_980;
  LhsNested local_500;
  RhsNested pMStack_4f8;
  RhsNested pMStack_4f0;
  double dStack_4e8;
  double dStack_4e0;
  double dStack_4d8;
  double dStack_4d0;
  double dStack_4c8;
  double local_4c0;
  double dStack_4b8;
  double dStack_4b0;
  double dStack_4a8;
  double dStack_4a0;
  double dStack_498;
  double dStack_490;
  double dStack_488;
  double local_480;
  double dStack_478;
  double dStack_470;
  double dStack_468;
  double dStack_460;
  double dStack_458;
  double dStack_450;
  double dStack_448;
  double local_440;
  double dStack_438;
  double dStack_430;
  double dStack_428;
  double dStack_420;
  double dStack_418;
  double dStack_410;
  double dStack_408;
  double local_400;
  double dStack_3f8;
  double dStack_3f0;
  double dStack_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double dStack_3d0;
  double dStack_3c8;
  double local_3c0;
  double dStack_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double dStack_398;
  double dStack_390;
  double dStack_388;
  double local_380;
  double dStack_378;
  double dStack_370;
  double dStack_368;
  double dStack_360;
  double dStack_358;
  double dStack_350;
  double dStack_348;
  double local_340;
  double dStack_338;
  double dStack_330;
  double dStack_328;
  double dStack_320;
  double dStack_318;
  double dStack_310;
  double dStack_308;
  double local_300;
  double dStack_2f8;
  double dStack_2f0;
  double dStack_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double local_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double local_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double dStack_230;
  double dStack_228;
  double dStack_220;
  double dStack_218;
  double dStack_210;
  double dStack_208;
  double local_200;
  double dStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  double dStack_1e0;
  double dStack_1d8;
  double dStack_1d0;
  double dStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double dStack_198;
  double dStack_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  double dStack_158;
  double dStack_150;
  double dStack_148;
  double local_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  double dStack_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double dStack_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  undefined1 extraout_var [56];
  
  peVar9 = (this->section).
           super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1f60._152_8_ = eta;
  local_1f60._160_8_ = Fforce;
  if (peVar9 == (element_type *)0x0) {
    puStack_1f88 = (undefined1 *)0x67786f;
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x361,
                  "virtual void chrono::fea::ChElementBeamEuler::EvaluateSectionForceTorque(const double, ChVector<> &, ChVector<> &)"
                 );
  }
  puStack_1f88 = (undefined1 *)0x6767a7;
  (*(peVar9->super_ChBeamSection)._vptr_ChBeamSection[2])();
  puStack_1f88 = (undefined1 *)0x6767bd;
  local_1f60._144_8_ = eta;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[4])();
  puStack_1f88 = (undefined1 *)0x6767d3;
  local_1f60._136_8_ = eta;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[5])();
  puStack_1f88 = (undefined1 *)0x6767e9;
  local_1f60._128_8_ = eta;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[3])();
  puStack_1f88 = (undefined1 *)0x6767ff;
  local_1f60._120_8_ = eta;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[6])();
  puStack_1f88 = (undefined1 *)0x676812;
  local_1f68 = (ChElementBeamEuler *)eta;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[7])();
  puStack_1f88 = (undefined1 *)0x676828;
  local_1f60._192_8_ = eta;
  local_1f60._200_8_ = in_XMM0_Qb;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[8])();
  puStack_1f88 = (undefined1 *)0x67683e;
  local_1f60._176_8_ = eta;
  local_1f60._184_8_ = in_XMM0_Qb;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[9])();
  puStack_1f88 = (undefined1 *)0x676854;
  local_1f60._168_8_ = eta;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[10])();
  puStack_1f88 = (undefined1 *)0x676868;
  local_1f60._208_8_ = eta;
  local_1f60._216_8_ = in_XMM0_Qb;
  local_1f60._96_8_ = cos((double)local_1f68);
  puStack_1f88 = (undefined1 *)0x67687c;
  auVar28._0_8_ = sin((double)local_1f68);
  auVar28._8_56_ = extraout_var;
  local_1f60._24_8_ = 1.0;
  local_1f60._32_8_ = 0.0;
  local_1f60._40_8_ = -0.0;
  dVar33 = auVar28._0_8_ * 0.0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_1f60._96_8_;
  dVar38 = (double)local_1f60._96_8_ * 0.0;
  local_1f60._48_8_ = dVar33 - dVar38;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar33;
  auVar17 = vfmadd213sd_fma(ZEXT816(0),auVar17,auVar23);
  local_1f60._56_8_ = auVar17._0_8_;
  local_1f60._64_8_ = auVar28._0_8_;
  local_1f60._72_8_ = dVar38 + dVar33;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar38;
  auVar17 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar21,auVar28._0_16_);
  local_1f60._80_8_ = auVar17._0_8_;
  local_1f60._88_8_ = local_1f60._96_8_;
  local_1640._256_8_ = 0;
  local_1640._264_8_ = 0;
  local_1640._272_8_ = 0;
  local_1640._280_8_ = 0;
  local_1640._192_8_ = 0;
  local_1640._200_8_ = 0;
  local_1640._208_8_ = 0;
  local_1640._216_8_ = 0;
  local_1640._224_8_ = 0;
  local_1640._232_8_ = 0;
  local_1640._240_8_ = 0;
  local_1640._248_8_ = 0;
  local_1640._128_8_ = 0;
  local_1640._136_8_ = 0;
  local_1640._144_8_ = 0;
  local_1640._152_8_ = 0;
  local_1640._160_8_ = 0;
  local_1640._168_8_ = 0;
  local_1640._176_8_ = 0;
  local_1640._184_8_ = 0;
  local_1640._64_8_ = 0;
  local_1640._72_8_ = 0;
  local_1640._80_8_ = 0;
  local_1640._88_8_ = 0;
  local_1640._96_8_ = 0;
  local_1640._104_8_ = 0;
  local_1640._112_8_ = 0;
  local_1640._120_8_ = 0;
  local_1640._0_8_ = 0;
  local_1640._8_8_ = 0;
  local_1640._16_8_ = 0;
  local_1640._24_8_ = 0;
  local_1640._32_8_ = 0;
  local_1640._40_8_ = 0;
  local_1640._48_8_ = 0;
  local_1640._56_8_ = 0;
  lVar13 = 0;
  do {
    uVar1 = *(undefined8 *)(local_1f60 + lVar13 + 0x20);
    *(undefined8 *)(local_1640 + lVar13 * 2) = *(undefined8 *)(local_1f60 + lVar13 + 0x18);
    *(undefined8 *)(local_1640 + lVar13 * 2 + 8) = uVar1;
    *(undefined8 *)(local_1640 + lVar13 * 2 + 0x10) = *(undefined8 *)(local_1f60 + lVar13 + 0x28);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x48);
  local_1f60._112_8_ = Mtorque;
  lVar13 = 0x5c;
  do {
    uVar1 = *(undefined8 *)(&stack0xffffffffffffe064 + lVar13);
    *(undefined8 *)(local_1640 + lVar13 * 2 + -0x10) = *(undefined8 *)((long)&uStack_1fa4 + lVar13);
    *(undefined8 *)(local_1640 + lVar13 * 2 + -8) = uVar1;
    *(undefined8 *)(local_1640 + lVar13 * 2) = *(undefined8 *)(auStack_1f9a + lVar13 + 6);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0xa4);
  lVar13 = 0;
  puStack_1f88 = (undefined1 *)0x67699e;
  memset(&local_e00,0,0x480);
  do {
    uVar1 = *(undefined8 *)(local_1f60 + lVar13 + 0x20);
    *(undefined8 *)
     ((long)local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)(local_1f60 + lVar13 + 0x18);
    *(undefined8 *)
     ((long)local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + 8) = uVar1;
    *(undefined8 *)
     ((long)local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + 0x10) = *(undefined8 *)(local_1f60 + lVar13 + 0x28);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x48);
  lVar13 = 0x52;
  do {
    uVar1 = *(undefined8 *)((long)&uStack_1f92 + lVar13);
    *(undefined8 *)((long)auStack_e10 + lVar13 * 4) =
         *(undefined8 *)(&stack0xffffffffffffe064 + lVar13 + 2);
    *(undefined8 *)((long)auStack_e10 + lVar13 * 4 + 8) = uVar1;
    *(undefined8 *)
     ((long)local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)(&stack0xffffffffffffe076 + lVar13);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x9a);
  lVar13 = 0xa0;
  do {
    uVar1 = *(undefined8 *)((long)auStack_1fe8 + lVar13 + 8);
    *(undefined8 *)((long)auStack_e10 + lVar13 * 4) = *(undefined8 *)((long)auStack_1fe8 + lVar13);
    *(undefined8 *)((long)auStack_e10 + lVar13 * 4 + 8) = uVar1;
    *(undefined8 *)
     ((long)local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)((long)auStack_1fe8 + lVar13 + 0x10);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0xe8);
  lVar13 = 0xee;
  do {
    uVar1 = *(undefined8 *)((long)auStack_2036 + lVar13 + 8);
    *(undefined8 *)((long)auStack_e10 + lVar13 * 4) = *(undefined8 *)((long)auStack_2036 + lVar13);
    *(undefined8 *)((long)auStack_e10 + lVar13 * 4 + 8) = uVar1;
    *(undefined8 *)
     ((long)local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)((long)auStack_2036 + lVar13 + 0x10);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x136);
  puVar15 = (undefined8 *)(local_1f60 + 0xe0);
  uStack_1d80 = 0;
  uStack_1d78 = 0;
  uStack_1d70 = 0;
  uStack_1d68 = 0;
  local_1dc0 = 0;
  uStack_1db8 = 0;
  local_1db0 = 0;
  uStack_1da8 = 0;
  local_1da0 = 0;
  uStack_1d98 = 0;
  uStack_1d90 = 0;
  uStack_1d88 = 0;
  local_1e00 = 0;
  uStack_1df8 = 0;
  uStack_1df0 = 0;
  uStack_1de8 = 0;
  uStack_1de0 = 0;
  uStack_1dd8 = 0;
  uStack_1dd0 = 0;
  uStack_1dc8 = 0;
  local_1e40 = 0;
  uStack_1e30 = 0;
  uStack_1e28 = 0;
  uStack_1e20 = 0;
  uStack_1e18 = 0;
  uStack_1e10 = 0;
  local_1f60._224_8_ = 0.0;
  dStack_1e78 = 0.0;
  dStack_1e70 = 0.0;
  dStack_1e68 = 0.0;
  dStack_1e50 = 0.0;
  dStack_1e48 = 0.0;
  lVar13 = 0;
  do {
    *puVar15 = 0x3ff0000000000000;
    lVar13 = lVar13 + 0x30;
    puVar15 = puVar15 + 7;
  } while (lVar13 != 0x120);
  pMStack_1e60 = (LhsNested)local_1f60._176_8_;
  auVar24._0_8_ = -(double)local_1f60._192_8_;
  auVar24._8_4_ = (int)local_1f60._200_8_;
  auVar24._12_4_ = SUB84(local_1f60._200_8_,4) ^ 0x80000000;
  dStack_1e58 = (double)vmovlps_avx(auVar24);
  local_1f60._96_8_ = -0.0;
  local_1f60._104_8_ = -0.0;
  auVar18._0_8_ = -(double)local_1f60._176_8_;
  auVar18._8_4_ = (int)local_1f60._184_8_;
  auVar18._12_4_ = SUB84(local_1f60._184_8_,4) ^ 0x80000000;
  uStack_1e38 = vmovlps_avx(auVar18);
  pMStack_1e08 = (LhsNested)local_1f60._192_8_;
  puVar15 = (undefined8 *)(local_1640 + 0x140);
  lVar13 = 0;
  puStack_1f88 = (undefined1 *)0x676b0b;
  memset(puVar15,0,0x480);
  do {
    *puVar15 = 0x3ff0000000000000;
    lVar13 = lVar13 + 0x60;
    puVar15 = puVar15 + 0xd;
  } while (lVar13 != 0x480);
  local_1640._320_8_ = local_1f60._224_8_;
  dStack_14f8 = dStack_1e78;
  local_14f0 = dStack_1e70;
  dStack_14e8 = dStack_1e68;
  local_14e0 = pMStack_1e60;
  dStack_14d8 = dStack_1e58;
  local_14a0 = dStack_1e50;
  dStack_1498 = dStack_1e48;
  local_1490 = local_1e40;
  uStack_1488 = uStack_1e38;
  local_1480 = uStack_1e30;
  uStack_1478 = uStack_1e28;
  local_1440 = uStack_1e20;
  uStack_1438 = uStack_1e18;
  local_1430 = uStack_1e10;
  pMStack_1428 = pMStack_1e08;
  local_1420 = local_1e00;
  uStack_1418 = uStack_1df8;
  local_13e0 = uStack_1df0;
  uStack_13d8 = uStack_1de8;
  local_13d0 = uStack_1de0;
  uStack_13c8 = uStack_1dd8;
  local_13c0 = uStack_1dd0;
  uStack_13b8 = uStack_1dc8;
  local_1380 = local_1dc0;
  uStack_1378 = uStack_1db8;
  local_1370 = local_1db0;
  uStack_1368 = uStack_1da8;
  local_1360 = local_1da0;
  uStack_1358 = uStack_1d98;
  local_1320 = uStack_1d90;
  uStack_1318 = uStack_1d88;
  local_1310 = uStack_1d80;
  uStack_1308 = uStack_1d78;
  local_1300 = uStack_1d70;
  uStack_12f8 = uStack_1d68;
  local_1290 = (double)local_1f60._224_8_;
  dStack_1288 = dStack_1e78;
  local_1280 = dStack_1e70;
  dStack_1278 = dStack_1e68;
  local_1270 = pMStack_1e60;
  dStack_1268 = dStack_1e58;
  local_1230 = dStack_1e50;
  dStack_1228 = dStack_1e48;
  local_1220 = local_1e40;
  uStack_1218 = uStack_1e38;
  local_1210 = uStack_1e30;
  uStack_1208 = uStack_1e28;
  local_11d0 = uStack_1e20;
  uStack_11c8 = uStack_1e18;
  local_11c0 = uStack_1e10;
  pMStack_11b8 = pMStack_1e08;
  local_11b0 = local_1e00;
  uStack_11a8 = uStack_1df8;
  local_1170 = uStack_1df0;
  uStack_1168 = uStack_1de8;
  local_1160 = uStack_1de0;
  uStack_1158 = uStack_1dd8;
  local_1150 = uStack_1dd0;
  uStack_1148 = uStack_1dc8;
  local_1110 = local_1dc0;
  uStack_1108 = uStack_1db8;
  local_1100 = local_1db0;
  uStack_10f8 = uStack_1da8;
  local_10f0 = local_1da0;
  uStack_10e8 = uStack_1d98;
  local_10b0 = uStack_1d90;
  uStack_10a8 = uStack_1d88;
  local_10a0 = uStack_1d80;
  uStack_1098 = uStack_1d78;
  local_1090 = uStack_1d70;
  uStack_1088 = uStack_1d68;
  local_f40._0_64_ = ZEXT864(0) << 0x20;
  puVar15 = (undefined8 *)local_f40;
  dStack_e40 = 0.0;
  dStack_e38 = 0.0;
  dStack_e30 = 0.0;
  dStack_e28 = 0.0;
  local_e80 = 0.0;
  dStack_e78 = SUB648(ZEXT864(0),4);
  local_e70 = 0.0;
  dStack_e68 = 0.0;
  lVar13 = 0;
  unique0x10003469 = local_f40._0_64_;
  _local_ec0 = local_f40._0_64_;
  local_e60 = dStack_e40;
  dStack_e58 = dStack_e38;
  dStack_e50 = dStack_e30;
  dStack_e48 = dStack_e28;
  do {
    *puVar15 = 0x3ff0000000000000;
    lVar13 = lVar13 + 0x30;
    puVar15 = puVar15 + 7;
  } while (lVar13 != 0x120);
  auVar20._8_8_ = local_1f60._216_8_;
  auVar20._0_8_ = local_1f60._208_8_;
  auVar19._8_8_ = 0x8000000000000000;
  auVar19._0_8_ = 0x8000000000000000;
  auVar17 = vxorpd_avx512vl(auVar20,auVar19);
  uVar1 = vmovlpd_avx(auVar17);
  dStack_ef8 = (double)uVar1;
  pMStack_ec8 = (LhsNested)local_1f60._168_8_;
  pdVar16 = (double *)&local_980;
  lVar13 = 0;
  puStack_1f88 = (undefined1 *)0x676da2;
  local_1f68 = this;
  memset(pdVar16,0,0x480);
  do {
    *pdVar16 = 1.0;
    lVar13 = lVar13 + 0x60;
    pdVar16 = pdVar16 + 0xd;
  } while (lVar13 != 0x480);
  local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [1] = (double)local_f40;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_f40._0_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [1] = (double)local_f40._8_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_f40._16_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [3] = (double)local_f40._24_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [4] = (double)local_f40._32_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [5] = (double)local_f40._40_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xc] = (double)local_f40._48_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xd] = (double)local_f40._56_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xe] = (double)local_f40._64_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xf] = dStack_ef8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x10] = dStack_ef0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x11] = dStack_ee8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x18] = dStack_ee0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x19] = dStack_ed8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1a] = dStack_ed0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1b] = (double)pMStack_ec8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1c] = (double)local_ec0._0_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1d] = (double)local_ec0._8_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x24] = dStack_eb0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x25] = dStack_ea8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x26] = dStack_ea0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x27] = dStack_e98;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x28] = dStack_e90;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x29] = dStack_e88;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x30] = local_e80;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x31] = dStack_e78;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x32] = local_e70;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x33] = dStack_e68;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x34] = local_e60;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x35] = dStack_e58;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3c] = dStack_e50;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3d] = dStack_e48;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3e] = dStack_e40;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3f] = dStack_e38;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x40] = dStack_e30;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x41] = dStack_e28;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x4e] = (double)local_f40._0_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x4f] = (double)local_f40._8_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x50] = (double)local_f40._16_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x51] = (double)local_f40._24_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x52] = (double)local_f40._32_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x53] = (double)local_f40._40_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5a] = (double)local_f40._48_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5b] = (double)local_f40._56_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5c] = (double)local_f40._64_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5d] = dStack_ef8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5e] = dStack_ef0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5f] = dStack_ee8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x66] = dStack_ee0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x67] = dStack_ed8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x68] = dStack_ed0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x69] = (double)pMStack_ec8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x6a] = (double)local_ec0._0_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x6b] = (double)local_ec0._8_8_;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x72] = dStack_eb0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x73] = dStack_ea8;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x74] = dStack_ea0;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x75] = dStack_e98;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x76] = dStack_e90;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x77] = dStack_e88;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x7e] = local_e80;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x7f] = dStack_e78;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x80] = local_e70;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x81] = dStack_e68;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x82] = local_e60;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x83] = dStack_e58;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8a] = dStack_e50;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8b] = dStack_e48;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8c] = dStack_e40;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8d] = dStack_e38;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8e] = dStack_e30;
  local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8f] = dStack_e28;
  local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_1640;
  local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = (double)(local_1f60 + 0xe0);
  puStack_1f88 = (undefined1 *)0x676fa5;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_6,_6,_1,_6,_6> *)local_1c20,
             (Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
              *)&local_1ac0,(assign_op<double,_double> *)&local_500,(type)0x0);
  puStack_1f88 = (undefined1 *)0x676fd7;
  local_1d40.m_lhs = &local_e00;
  local_1d40.m_rhs = &local_980;
  pMStack_1d30 = (Matrix<double,_12,_12,_1,_12,_12> *)(local_1640 + 0x140);
  memset(&local_1ac0,0,0x480);
  local_1080 = (assign_op<double,_double> *)0x3ff0000000000000;
  puStack_1f88 = (undefined1 *)0x676ff0;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
            (&local_1ac0,&local_1d40,(Matrix<double,_12,_12,_1,_12,_12> *)(local_1640 + 0x140),
             (Scalar *)&local_1080);
  pCVar11 = local_1f68;
  local_500 = (LhsNested)
              local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0];
  pMStack_4f8 = (RhsNested)
                local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                m_storage.m_data.array[1];
  pMStack_4f0 = (RhsNested)
                local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                m_storage.m_data.array[2];
  dStack_4e8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[3];
  dStack_4e0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[4];
  dStack_4d8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[5];
  dStack_4d0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[6];
  dStack_4c8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[7];
  local_4c0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[8];
  dStack_4b8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[9];
  dStack_4b0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[10];
  dStack_4a8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0xb];
  dStack_4a0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0xc];
  dStack_498 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0xd];
  dStack_490 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0xe];
  dStack_488 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0xf];
  local_480 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x10];
  dStack_478 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x11];
  dStack_470 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x12];
  dStack_468 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x13];
  dStack_460 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x14];
  dStack_458 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x15];
  dStack_450 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x16];
  dStack_448 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x17];
  local_440 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x18];
  dStack_438 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x19];
  dStack_430 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x1a];
  dStack_428 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x1b];
  dStack_420 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x1c];
  dStack_418 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x1d];
  dStack_410 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x1e];
  dStack_408 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x1f];
  local_400 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x20];
  dStack_3f8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x21];
  dStack_3f0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x22];
  dStack_3e8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x23];
  dStack_3e0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x24];
  dStack_3d8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x25];
  dStack_3d0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x26];
  dStack_3c8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x27];
  local_3c0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x28];
  dStack_3b8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x29];
  dStack_3b0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x2a];
  dStack_3a8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x2b];
  dStack_3a0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x2c];
  dStack_398 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x2d];
  dStack_390 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x2e];
  dStack_388 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x2f];
  local_380 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x30];
  dStack_378 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x31];
  dStack_370 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x32];
  dStack_368 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x33];
  dStack_360 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x34];
  dStack_358 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x35];
  dStack_350 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x36];
  dStack_348 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x37];
  local_340 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x38];
  dStack_338 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x39];
  dStack_330 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x3a];
  dStack_328 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x3b];
  dStack_320 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x3c];
  dStack_318 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x3d];
  dStack_310 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x3e];
  dStack_308 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x3f];
  local_300 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x40];
  dStack_2f8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x41];
  dStack_2f0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x42];
  dStack_2e8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x43];
  dStack_2e0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x44];
  dStack_2d8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x45];
  dStack_2d0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x46];
  dStack_2c8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x47];
  local_2c0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x48];
  dStack_2b8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x49];
  dStack_2b0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x4a];
  dStack_2a8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x4b];
  dStack_2a0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x4c];
  dStack_298 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x4d];
  dStack_290 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x4e];
  dStack_288 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x4f];
  local_280 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x50];
  dStack_278 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x51];
  dStack_270 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x52];
  dStack_268 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x53];
  dStack_260 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x54];
  dStack_258 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x55];
  dStack_250 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x56];
  dStack_248 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x57];
  local_240 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x58];
  dStack_238 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x59];
  dStack_230 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x5a];
  dStack_228 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x5b];
  dStack_220 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x5c];
  dStack_218 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x5d];
  dStack_210 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x5e];
  dStack_208 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x5f];
  local_200 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x60];
  dStack_1f8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x61];
  dStack_1f0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x62];
  dStack_1e8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[99];
  dStack_1e0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[100];
  dStack_1d8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x65];
  dStack_1d0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x66];
  dStack_1c8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x67];
  local_1c0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x68];
  dStack_1b8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x69];
  dStack_1b0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x6a];
  dStack_1a8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x6b];
  dStack_1a0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x6c];
  dStack_198 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x6d];
  dStack_190 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x6e];
  dStack_188 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x6f];
  local_180 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x70];
  dStack_178 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x71];
  dStack_170 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x72];
  dStack_168 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x73];
  dStack_160 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x74];
  dStack_158 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x75];
  dStack_150 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x76];
  dStack_148 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x77];
  local_140 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x78];
  dStack_138 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x79];
  dStack_130 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x7a];
  dStack_128 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x7b];
  dStack_120 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x7c];
  dStack_118 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x7d];
  dStack_110 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x7e];
  dStack_108 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0x7f];
  local_100 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x80];
  dStack_f8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x81];
  dStack_f0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x82];
  dStack_e8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x83];
  dStack_e0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x84];
  dStack_d8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x85];
  dStack_d0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x86];
  dStack_c8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x87];
  local_c0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
             m_data.array[0x88];
  dStack_b8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x89];
  dStack_b0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x8a];
  dStack_a8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x8b];
  dStack_a0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x8c];
  dStack_98 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x8d];
  dStack_90 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x8e];
  dStack_88 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
              m_data.array[0x8f];
  puStack_1f88 = (undefined1 *)0x67710e;
  iVar12 = (*(local_1f68->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[3])(local_1f68);
  local_1f60._0_8_ = (double *)0x0;
  local_1f60._8_8_ = 0.0;
  puStack_1f88 = (undefined1 *)0x677123;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1f60,(long)iVar12);
  puStack_1f88 = (undefined1 *)0x677134;
  (*(pCVar11->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6]
  )(pCVar11,(RhsNested)local_1f60);
  if ((double)local_1f60._8_8_ == 5.92878775009496e-323) {
    local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    puStack_1f88 = (undefined1 *)0x67717d;
    local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)&local_500;
    local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[1] = (double)local_1f60;
    pvVar14 = malloc(0xa0);
    if (pvVar14 == (void *)0x0) {
      pdVar16 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar14 & 0xffffffffffffffc0) + 0x38) = pvVar14;
      pdVar16 = (double *)(((ulong)pvVar14 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar16 == (double *)0x0) {
      puStack_1f88 = (undefined1 *)0x677898;
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = std::ostream::_M_insert<bool>;
      puStack_1f88 = &LAB_006778bc;
      __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0xc
    ;
    puStack_1f88 = (undefined1 *)0x6771c2;
    local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar16;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_1f80,(SrcXprType *)&local_1ac0,(assign_op<double,_double> *)&local_1d40);
    if ((((0 < local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows) &&
         (6 < local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows)) &&
        (local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         != 7)) &&
       (0xb < local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows)) {
      dVar33 = (pCVar11->super_ChElementBeam).length;
      auVar29._0_8_ = 1.0 / dVar33;
      auVar29._8_8_ = 0;
      auVar31._0_8_ = local_1f60._96_8_ ^ (ulong)auVar29._0_8_;
      auVar31._8_8_ = local_1f60._104_8_;
      auVar39._0_8_ = 6.0 / (dVar33 * dVar33);
      auVar39._8_8_ = 0;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_1f60._152_8_;
      auVar18 = vmulsd_avx512f(auVar39,auVar49);
      auVar40._0_8_ = local_1f60._96_8_ ^ (ulong)auVar39._0_8_;
      auVar40._8_8_ = local_1f60._104_8_;
      auVar19 = vmulsd_avx512f(auVar40,auVar49);
      auVar41._0_8_ = 3.0 / dVar33;
      auVar41._8_8_ = 0;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_1f60._152_8_;
      auVar24 = vfmsub213sd_fma(auVar50,auVar41,auVar29);
      auVar20 = vfmadd213sd_avx512f(auVar50,auVar41,auVar29);
      auVar34._0_8_ = 12.0 / (dVar33 * dVar33 * dVar33);
      auVar34._8_8_ = 0;
      auVar42._0_8_ = (double)(local_1f60._96_8_ ^ (ulong)auVar34._0_8_);
      auVar42._8_8_ = local_1f60._104_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           *local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           auVar29._0_8_ *
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[6];
      auVar17 = vfmadd231sd_fma(auVar27,auVar31,auVar22);
      auVar43._8_8_ = 0;
      auVar43._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[5];
      auVar44._8_8_ = 0;
      auVar44._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[0xb];
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[1];
      auVar45._8_8_ = 0;
      auVar45._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[7] * auVar42._0_8_;
      auVar21 = vfmadd231sd_fma(auVar45,auVar34,auVar25);
      auVar21 = vfmadd231sd_fma(auVar21,auVar39,auVar43);
      auVar21 = vfmadd231sd_fma(auVar21,auVar39,auVar44);
      auVar10._8_8_ = 0x8000000000000000;
      auVar10._0_8_ = 0x8000000000000000;
      auVar21 = vxorpd_avx512vl(auVar21,auVar10);
      auVar17 = vunpcklpd_avx(auVar17,auVar21);
      auVar46._8_8_ = 0;
      auVar46._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[2];
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[4];
      auVar48._8_8_ = 0;
      auVar48._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[10];
      auVar35._8_8_ = 0;
      auVar35._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[8] * auVar34._0_8_;
      auVar21 = vfmadd231sd_fma(auVar35,auVar46,auVar42);
      auVar21 = vfmadd231sd_fma(auVar21,auVar39,auVar47);
      auVar21 = vfmadd231sd_fma(auVar21,auVar48,auVar39);
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ =
           auVar29._0_8_ *
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[9];
      auVar23 = vfmadd231sd_fma(auVar30,auVar31,auVar26);
      auVar21 = vunpcklpd_avx(auVar21,auVar23);
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[8] * auVar19._0_8_;
      auVar23 = vfnmsub231sd_fma(auVar32,auVar18,auVar46);
      auVar23 = vfmadd231sd_fma(auVar23,auVar24,auVar47);
      auVar22 = vfmadd231sd_avx512f(auVar23,auVar20,auVar48);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[1];
      auVar36._8_8_ = 0;
      auVar36._0_8_ =
           local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[7] * auVar19._0_8_;
      auVar23 = vfmadd231sd_fma(auVar36,auVar18,auVar2);
      auVar23 = vfmadd231sd_fma(auVar23,auVar43,auVar24);
      auVar23 = vfmadd231sd_avx512f(auVar23,auVar44,auVar20);
      auVar23 = vunpcklpd_avx(auVar22,auVar23);
      local_1d40.m_rhs = (RhsNested)0x0;
      pMStack_1d30 = (Matrix<double,_12,_12,_1,_12,_12> *)0x0;
      uStack_1d28 = 0;
      uStack_1d20 = 0;
      uStack_1d18 = 0;
      uStack_1d10 = 0;
      local_1d00 = 0;
      uStack_1cf8 = 0;
      uStack_1cf0 = 0;
      uStack_1ce8 = 0;
      auStack_1ce0[0] = 0;
      auStack_1ce0[1] = 0;
      uStack_1cc8 = 0;
      local_1cc0 = 0;
      uStack_1cb8 = 0;
      auStack_1cb0[0] = 0;
      auStack_1cb0[1] = 0;
      auStack_1cb0[2] = 0;
      uStack_1c90 = 0;
      uStack_1c88 = 0;
      auStack_1c50[2] = 0;
      auStack_1c50[3] = 0;
      auStack_1c50[4] = 0;
      auStack_1c80[0] = 0;
      auStack_1c80[1] = 0;
      auStack_1c80[2] = 0;
      auStack_1c80[3] = 0;
      uStack_1c58 = 0;
      auStack_1c50[0] = 0;
      auStack_1c50[1] = 0;
      local_1d40.m_lhs = (LhsNested)local_1f60._144_8_;
      pMStack_1d08 = (LhsNested)local_1f60._128_8_;
      pMStack_1cd0 = (LhsNested)local_1f60._136_8_;
      pMStack_1c98 = (LhsNested)local_1f60._120_8_;
      local_1c60 = (LhsNested)local_1f60._136_8_;
      pMStack_1c28 = (LhsNested)local_1f60._128_8_;
      dStack_f80 = 0.0;
      dStack_f78 = 0.0;
      dStack_f70 = 0.0;
      dStack_f68 = 0.0;
      local_fc0 = 0.0;
      local_fb8 = 0.0;
      local_fb0 = 0.0;
      local_fa8 = 0.0;
      local_fa0 = 0.0;
      dStack_f98 = 0.0;
      dStack_f90 = 0.0;
      dStack_f88 = 0.0;
      local_1000 = 0.0;
      dStack_ff8 = 0.0;
      dStack_ff0 = 0.0;
      dStack_fe8 = 0.0;
      dStack_fe0 = 0.0;
      dStack_fd8 = 0.0;
      dStack_fd0 = 0.0;
      dStack_fc8 = 0.0;
      local_1040 = 0.0;
      dStack_1038 = 0.0;
      dStack_1030 = 0.0;
      dStack_1028 = 0.0;
      pMStack_1020 = (RhsNested)0x0;
      dStack_1018 = 0.0;
      dStack_1010 = 0.0;
      dStack_1008 = 0.0;
      local_1080 = (assign_op<double,_double> *)0x0;
      dStack_1078 = 0.0;
      dStack_1070 = 0.0;
      dStack_1068 = 0.0;
      dStack_1060 = 0.0;
      dStack_1058 = 0.0;
      pMStack_1050 = (RhsNested)0x0;
      dStack_1048 = 0.0;
      pdVar16 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                m_storage.m_data.array + 4;
      lVar13 = 0;
      do {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (&local_1d40.m_lhs)[lVar13];
        auVar24 = vmovddup_avx512vl(auVar3);
        auVar18 = vmulpd_avx512vl(local_1c20,auVar24);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (&uStack_1d10)[lVar13];
        auVar19 = vmovddup_avx512vl(auVar4);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1bf0,auVar19);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auStack_1ce0[lVar13];
        auVar20 = vmovddup_avx512vl(auVar5);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1bc0,auVar20);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auStack_1cb0[lVar13];
        auVar22 = vmovddup_avx512vl(auVar6);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1b90,auVar22);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auStack_1c80[lVar13];
        auVar25 = vmovddup_avx512vl(auVar7);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1b60,auVar25);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auStack_1c50[lVar13];
        auVar26 = vmovddup_avx512vl(auVar8);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1b30,auVar26);
        *(undefined1 (*) [16])((plain_array<double,_144,_1,_64> *)(pdVar16 + -4))->array = auVar18;
        auVar18 = vmulpd_avx512vl(local_1c10,auVar24);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1be0,auVar19);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1bb0,auVar20);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1b80,auVar22);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1b50,auVar25);
        auVar18 = vfmadd231pd_avx512vl(auVar18,local_1b20,auVar26);
        *(undefined1 (*) [16])(pdVar16 + -2) = auVar18;
        auVar24 = vmulpd_avx512vl(local_1c00,auVar24);
        auVar24 = vfmadd231pd_avx512vl(auVar24,local_1bd0,auVar19);
        auVar24 = vfmadd231pd_avx512vl(auVar24,local_1ba0,auVar20);
        auVar24 = vfmadd231pd_avx512vl(auVar24,local_1b70,auVar22);
        auVar24 = vfmadd231pd_avx512vl(auVar24,local_1b40,auVar25);
        auVar24 = vfmadd231pd_avx512vl(auVar24,local_1b10,auVar26);
        *(undefined1 (*) [16])pdVar16 = auVar24;
        lVar13 = lVar13 + 1;
        pdVar16 = pdVar16 + 6;
      } while (lVar13 != 6);
      pdVar16 = &dStack_1060;
      local_1080 = (assign_op<double,_double> *)
                   local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0];
      dStack_1078 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[6];
      dStack_1070 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0xc];
      dStack_1068 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0x12];
      dStack_1060 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0x18];
      dStack_1058 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0x1e];
      pMStack_1050 = (RhsNested)
                     local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                     m_storage.m_data.array[1];
      dStack_1048 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[7];
      local_1040 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0xd];
      dStack_1038 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0x13];
      dStack_1030 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0x19];
      dStack_1028 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0x1f];
      pMStack_1020 = (RhsNested)
                     local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                     m_storage.m_data.array[2];
      dStack_1018 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[8];
      dStack_1010 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0xe];
      dStack_1008 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                    m_storage.m_data.array[0x14];
      local_1000 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x1a];
      dStack_ff8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x20];
      dStack_ff0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[3];
      dStack_fe8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[9];
      dStack_fe0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0xf];
      dStack_fd8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x15];
      dStack_fd0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x1b];
      dStack_fc8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x21];
      local_fc0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                  m_storage.m_data.array[4];
      local_fb8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                  m_storage.m_data.array[10];
      local_fb0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                  m_storage.m_data.array[0x10];
      local_fa8 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                  m_storage.m_data.array[0x16];
      local_fa0 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                  m_storage.m_data.array[0x1c];
      dStack_f98 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x22];
      dStack_f90 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[5];
      dStack_f88 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0xb];
      dStack_f80 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x11];
      dStack_f78 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x17];
      dStack_f70 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x1d];
      dStack_f68 = local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                   m_storage.m_data.array[0x23];
      lVar13 = 0;
      do {
        dVar33 = auVar17._0_8_ * pdVar16[-4] +
                 auVar21._0_8_ * pdVar16[-2] + auVar23._0_8_ * *pdVar16;
        dVar38 = auVar17._8_8_ * pdVar16[-3] +
                 auVar21._8_8_ * pdVar16[-1] + auVar23._8_8_ * pdVar16[1];
        auVar37._0_8_ = dVar33 + dVar38;
        auVar37._8_8_ = dVar33 + dVar38;
        uVar1 = vmovlpd_avx(auVar37);
        *(undefined8 *)(local_1af0 + lVar13 * 8) = uVar1;
        lVar13 = lVar13 + 1;
        pdVar16 = pdVar16 + 6;
      } while (lVar13 != 6);
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[1] = 1.48219693752374e-323;
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[4] = 0.0;
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[6] = 2.96439387504748e-323;
      puStack_1f88 = (undefined1 *)0x6777c4;
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[0] = (double)local_1af0;
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[3] = (double)local_1af0;
      ChVector<double>::operator=
                ((ChVector<double> *)local_1f60._160_8_,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                 &local_1ac0);
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[0] = (double)(local_1af0 + 0x18);
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[1] = 1.48219693752374e-323;
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[4] = 1.48219693752374e-323;
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[6] = 2.96439387504748e-323;
      puStack_1f88 = (undefined1 *)0x6777fd;
      local_1ac0.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[3] = (double)local_1af0;
      ChVector<double>::operator=
                ((ChVector<double> *)local_1f60._112_8_,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                 &local_1ac0);
      if (local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          != (double *)0x0) {
        puStack_1f88 = (undefined1 *)0x67780f;
        free((void *)local_1f80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[-1]);
      }
      if ((double *)local_1f60._0_8_ != (double *)0x0) {
        puStack_1f88 = (undefined1 *)0x677822;
        free(*(void **)(local_1f60._0_8_ + -8));
      }
      return;
    }
    puStack_1f88 = (undefined1 *)0x677850;
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  puStack_1f88 = (undefined1 *)0x67788e;
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, 12, 12, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 12, 12, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementBeamEuler::EvaluateSectionForceTorque(const double eta, ChVector<>& Fforce, ChVector<>& Mtorque) {
    assert(section);

    double EA = this->section->GetAxialRigidity();
    double EIyy = this->section->GetYbendingRigidity();
    double EIzz = this->section->GetZbendingRigidity();
    double GJ = this->section->GetXtorsionRigidity();
    double alpha = this->section->GetSectionRotation();
    double Cy = this->section->GetCentroidY();
    double Cz = this->section->GetCentroidZ();
    double Sy = this->section->GetShearCenterY();
    double Sz = this->section->GetShearCenterZ();

    // The shear center offset is respect to the centerline.
    // In case the section has a shear center displacement:
    //Sy = Sy - Cy;   // Unnecessary to do this substraction
    //Sz = Sz - Cz;

    ChMatrix33<> Rotsect0;
    Rotsect0.Set_A_Rxyz(ChVector<>(alpha, 0, 0));
    ChMatrixNM<double, 6, 6> RotsectA;
    RotsectA.setZero();
    RotsectA.block<3, 3>(0, 0) = Rotsect0;
    RotsectA.block<3, 3>(3, 3) = Rotsect0;
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = Rotsect0;
    Rotsect.block<3, 3>(3, 3) = Rotsect0;
    Rotsect.block<3, 3>(6, 6) = Rotsect0;
    Rotsect.block<3, 3>(9, 9) = Rotsect0;

    ChMatrixNM<double, 6, 6> TcA;
    TcA.setIdentity();
    TcA(0, 4) = Cz;
    TcA(0, 5) = -Cy;
    TcA(1, 3) = -Cz;
    TcA(2, 3) = Cy;
    ChMatrixNM<double, 12, 12> Tc;
    Tc.setIdentity();
    Tc.block<6, 6>(0, 0) = TcA;
    Tc.block<6, 6>(6, 6) = TcA;

    ChMatrixNM<double, 6, 6> TsA;
    TsA.setIdentity();
    TsA(1, 3) = -Sz;
    TsA(2, 3) = Sy;
    ChMatrixNM<double, 12, 12> Ts;
    Ts.setIdentity();
    Ts.block<6, 6>(0, 0) = TsA;
    Ts.block<6, 6>(6, 6) = TsA;


    ChMatrixNM<double, 6, 6> TA;
    TA = RotsectA * TsA * TcA;
    ChMatrixNM<double, 12, 12> T;
    T = Rotsect * Ts * Tc;

    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    ChVectorDynamic<> displ_ec = T * displ;

    // ShapeVector N;
    // ShapeFunctions(N, eta);  // Evaluate compressed shape functions

    // shape function derivatives are computed here on-the-fly
    double dN_xa = -(1. / length);
    double dN_xb = (1. / length);
    double ddN_ua = (6. / (length * length)) * (eta);
    double ddN_ub = -(6. / (length * length)) * (eta);
    double ddN_ra = -(1. / length) + ((3.0 / length) * eta);
    double ddN_rb = (1. / length) + ((3.0 / length) * eta);
    double dddN_ua = (12. / (length * length * length));
    double dddN_ub = -(12. / (length * length * length));
    double dddN_ra = (6.0 / (length * length));
    double dddN_rb = (6.0 / (length * length));

    // generalized strains/curvatures;
    ChVectorN<double, 6> sect_ek;

    // e_x
    sect_ek(0) = (dN_xa * displ_ec(0) + dN_xb * displ_ec(6));  // x_a   x_b
    // e_y
    sect_ek(1) = (dddN_ua * displ_ec(1) + dddN_ub * displ_ec(7) +  // y_a   y_b
                  dddN_ra * displ_ec(5) + dddN_rb * displ_ec(11));  // Rz_a  Rz_b
    sect_ek(1) *= -1.0;
    // e_z
    sect_ek(2) = (-dddN_ua * displ_ec(2) - dddN_ub * displ_ec(8) +  // z_a   z_b   note - sign
                  dddN_ra * displ_ec(4) + dddN_rb * displ_ec(10));  // Ry_a  Ry_b
    
    // k_x
    sect_ek(3) = (dN_xa * displ_ec(3) + dN_xb * displ_ec(9));  // Rx_a  Rx_b
    // k_y
    sect_ek(4) = (-ddN_ua * displ_ec(2) - ddN_ub * displ_ec(8) +  // z_a   z_b   note - sign
                  ddN_ra * displ_ec(4) + ddN_rb * displ_ec(10));  // Ry_a  Ry_b
    // k_z
    sect_ek(5) = (ddN_ua * displ_ec(1) + ddN_ub * displ_ec(7) +  // y_a   y_b
                  ddN_ra * displ_ec(5) + ddN_rb * displ_ec(11));  // Rz_a  Rz_b

    if (false)  // section->alpha ==0 && section->Cy ==0 && section->Cz==0 && section->Sy==0 && section->Sz==0)
    {
        // Fast computation:
        Fforce.x() = EA   * sect_ek(0);
        Fforce.y() = EIzz * sect_ek(1);
        Fforce.z() = EIyy * sect_ek(2);

        Mtorque.x() = GJ   * sect_ek(3);
        Mtorque.y() = EIyy * sect_ek(4);
        Mtorque.z() = EIzz * sect_ek(5);
    } else {
        // Generic computation, by rotating and translating the constitutive
        // matrix of the beam:
        ChMatrixNM<double, 6, 6> Klaw_d;
        Klaw_d.setZero();
        Klaw_d(0, 0) = EA;
        Klaw_d(1, 1) = EIzz;
        Klaw_d(2, 2) = EIyy;
        Klaw_d(3, 3) = GJ;
        Klaw_d(4, 4) = EIyy;
        Klaw_d(5, 5) = EIzz;

        // ..unrolled rotated constitutive matrix..
        ChMatrixNM<double, 6, 6> Klaw_r;
        Klaw_r.setZero();
        Klaw_r = TA.transpose() * Klaw_d;

        // .. compute wrench = Klaw_l * sect_ek
        ChVectorN<double, 6> wrench = Klaw_r * sect_ek;
        Fforce = wrench.segment(0, 3);
        Mtorque = wrench.segment(3, 3);

    }
}